

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_build_transform(ALLEGRO_TRANSFORM *trans,float x,float y,float sx,float sy,float theta)

{
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float s;
  float c;
  
  fVar1 = cosf(in_XMM4_Da);
  fVar2 = sinf(in_XMM4_Da);
  *in_RDI = in_XMM2_Da * fVar1;
  in_RDI[1] = in_XMM3_Da * fVar2;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  in_RDI[4] = -in_XMM2_Da * fVar2;
  in_RDI[5] = in_XMM3_Da * fVar1;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[8] = 0.0;
  in_RDI[9] = 0.0;
  in_RDI[10] = 1.0;
  in_RDI[0xb] = 0.0;
  in_RDI[0xc] = in_XMM0_Da;
  in_RDI[0xd] = in_XMM1_Da;
  in_RDI[0xe] = 0.0;
  in_RDI[0xf] = 1.0;
  return;
}

Assistant:

void al_build_transform(ALLEGRO_TRANSFORM *trans, float x, float y,
   float sx, float sy, float theta)
{
   float c, s;
   ASSERT(trans);

   c = cosf(theta);
   s = sinf(theta);

   trans->m[0][0] = sx * c;
   trans->m[0][1] = sy * s;
   trans->m[0][2] = 0;
   trans->m[0][3] = 0;

   trans->m[1][0] = -sx * s;
   trans->m[1][1] = sy * c;
   trans->m[1][2] = 0;
   trans->m[1][3] = 0;

   trans->m[2][0] = 0;
   trans->m[2][1] = 0;
   trans->m[2][2] = 1;
   trans->m[2][3] = 0;

   trans->m[3][0] = x;
   trans->m[3][1] = y;
   trans->m[3][2] = 0;
   trans->m[3][3] = 1;
}